

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbirb.cpp
# Opt level: O3

BreakIterator *
icu_63::RBBIRuleBuilder::createRuleBasedBreakIterator
          (UnicodeString *rules,UParseError *parseError,UErrorCode *status)

{
  RBBIDataHeader *data;
  RuleBasedBreakIterator *this;
  UErrorCode *size;
  RBBIRuleBuilder builder;
  RBBIRuleBuilder RStack_d8;
  
  RBBIRuleBuilder(&RStack_d8,rules,parseError,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    size = status;
    data = build(&RStack_d8,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      this = (RuleBasedBreakIterator *)UMemory::operator_new((UMemory *)0x280,(size_t)size);
      if (this == (RuleBasedBreakIterator *)0x0) {
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          *status = U_MEMORY_ALLOCATION_ERROR;
        }
      }
      else {
        RuleBasedBreakIterator::RuleBasedBreakIterator(this,data,status);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_001570c5;
        (*(this->super_BreakIterator).super_UObject._vptr_UObject[1])(this);
      }
    }
  }
  this = (RuleBasedBreakIterator *)0x0;
LAB_001570c5:
  ~RBBIRuleBuilder(&RStack_d8);
  return &this->super_BreakIterator;
}

Assistant:

BreakIterator *
RBBIRuleBuilder::createRuleBasedBreakIterator( const UnicodeString    &rules,
                                    UParseError      *parseError,
                                    UErrorCode       &status)
{
    //
    // Read the input rules, generate a parse tree, symbol table,
    // and list of all Unicode Sets referenced by the rules.
    //
    RBBIRuleBuilder  builder(rules, parseError, status);
    if (U_FAILURE(status)) { // status checked here bcos build below doesn't
        return NULL;
    }

    RBBIDataHeader *data = builder.build(status);

    if (U_FAILURE(status)) {
        return nullptr;
    }

    //
    //  Create a break iterator from the compiled rules.
    //     (Identical to creation from stored pre-compiled rules)
    //
    // status is checked after init in construction.
    RuleBasedBreakIterator *This = new RuleBasedBreakIterator(data, status);
    if (U_FAILURE(status)) {
        delete This;
        This = NULL;
    } 
    else if(This == NULL) { // test for NULL
        status = U_MEMORY_ALLOCATION_ERROR;
    }
    return This;
}